

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
::get_options(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
              *this)

{
  Display DVar1;
  long in_RSI;
  _func_int **local_20;
  undefined4 local_14;
  
  local_14 = 1;
  std::make_unique<Oric::Machine::Options,Configurable::OptionsType>((OptionsType *)&local_20);
  DVar1 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0x20))
  ;
  *(Display *)(local_20 + 1) = DVar1;
  *(undefined1 *)((long)local_20 + 0xc) = *(undefined1 *)(in_RSI + 0x11d58);
  (this->super_TimedMachine)._vptr_TimedMachine = local_20;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->quickload = use_fast_tape_hack_;
			return options;
		}